

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall
LowererMD::GenerateIsJsObjectTest
          (LowererMD *this,RegOpnd *instanceReg,Instr *insertInstr,LabelInstr *labelHelper)

{
  uint32 uVar1;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar2;
  Instr *pIVar3;
  IntConstOpnd *newSrc;
  BranchInstr *instr;
  Instr *cmp;
  RegOpnd *typeReg;
  LabelInstr *labelHelper_local;
  Instr *insertInstr_local;
  RegOpnd *instanceReg_local;
  LowererMD *this_local;
  
  GenerateObjectTest(this,&instanceReg->super_Opnd,insertInstr,labelHelper,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  uVar1 = Js::RecyclableObject::GetOffsetOfType();
  pIVar2 = IR::IndirOpnd::New(instanceReg,uVar1,TyInt64,this->m_func,false);
  pIVar3 = IR::Instr::New(MOV,&baseOpnd->super_Opnd,&pIVar2->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar3);
  pIVar3 = IR::Instr::New(CMP,this->m_func);
  uVar1 = Js::Type::GetOffsetOfTypeId();
  pIVar2 = IR::IndirOpnd::New(baseOpnd,uVar1,TyInt32,this->m_func,false);
  IR::Instr::SetSrc1(pIVar3,&pIVar2->super_Opnd);
  newSrc = IR::IntConstOpnd::New(0x16,TyInt32,this->m_func,false);
  IR::Instr::SetSrc2(pIVar3,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,pIVar3);
  instr = IR::BranchInstr::New(JLE,labelHelper,this->m_func);
  IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
  return;
}

Assistant:

void LowererMD::GenerateIsJsObjectTest(IR::RegOpnd* instanceReg, IR::Instr* insertInstr, IR::LabelInstr* labelHelper)
{
    // TEST instanceReg, (Js::AtomTag_IntPtr | Js::FloatTag_Value )
    GenerateObjectTest(instanceReg, insertInstr, labelHelper);

    IR::RegOpnd * typeReg = IR::RegOpnd::New(TyMachReg, this->m_func);

    // MOV typeReg, instanceReg + offsetof(RecyclableObject::type)
    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, typeReg,
        IR::IndirOpnd::New(instanceReg, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
        m_func));

    // CMP [typeReg + offsetof(Type::typeid)], TypeIds_LastJavascriptPrimitiveType
    IR::Instr * cmp = IR::Instr::New(Js::OpCode::CMP, this->m_func);
    cmp->SetSrc1(IR::IndirOpnd::New(typeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func));
    cmp->SetSrc2(IR::IntConstOpnd::New(Js::TypeId::TypeIds_LastJavascriptPrimitiveType, TyInt32, this->m_func));
    insertInstr->InsertBefore(cmp);

    // JLE labelHelper
    insertInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::JLE, labelHelper, this->m_func));
}